

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

bool cfd::core::RandomNumberUtil::GetRandomBool(vector<bool,_std::allocator<bool>_> *random_cache)

{
  ulong uVar1;
  int iVar2;
  result_type_conflict rVar3;
  CfdException *this;
  int i;
  uint uVar4;
  reference rVar5;
  allocator local_41;
  string local_40;
  
  if (GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd == '\0') {
    iVar2 = __cxa_guard_acquire(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd);
    if (iVar2 != 0) {
      std::random_device::random_device(&GetRandomBool::rd);
      __cxa_atexit(std::random_device::~random_device,&GetRandomBool::rd,&__dso_handle);
      __cxa_guard_release(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd);
    }
  }
  if (GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine == '\0') {
    iVar2 = __cxa_guard_acquire(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine);
    if (iVar2 != 0) {
      uVar4 = ::std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&GetRandomBool::engine,(ulong)uVar4);
      __cxa_guard_release(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine);
    }
  }
  if (random_cache != (vector<bool,_std::allocator<bool>_> *)0x0) {
    if ((*(long *)random_cache == *(long *)(random_cache + 0x10)) &&
       (*(int *)(random_cache + 0x18) == 0)) {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&GetRandomBool::engine);
      for (uVar4 = 0; uVar4 != 0x20; uVar4 = uVar4 + 1) {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (random_cache,((uint)rVar3 >> (uVar4 & 0x1f) & 1) != 0);
      }
    }
    rVar5 = std::vector<bool,_std::allocator<bool>_>::back(random_cache);
    uVar1 = *rVar5._M_p;
    std::_Bit_iterator_base::_M_bump_down((_Bit_iterator_base *)(random_cache + 0x10));
    return (uVar1 & rVar5._M_mask) != 0;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_40,"GetRandomBool error.",&local_41);
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool RandomNumberUtil::GetRandomBool(std::vector<bool> *random_cache) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  if (random_cache == nullptr) {
    throw CfdException(kCfdIllegalArgumentError, "GetRandomBool error.");
  }

  if (random_cache->empty()) {
    uint32_t random = engine();
    for (int i = 0; i < 32; i++) {
      bool value = (random >> i) & 1;
      random_cache->push_back(value);
    }
  }
  bool ret = random_cache->back();
  random_cache->pop_back();
  return ret;
}